

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clientversion.cpp
# Opt level: O0

string * CopyrightHolders(string *strPrefix)

{
  long lVar1;
  size_type sVar2;
  string *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *strCopyrightHolders;
  string copyright_devs;
  bilingual_str *in_stack_ffffffffffffff18;
  string *this;
  uint in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  size_type in_stack_ffffffffffffff38;
  char *args;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  ConstevalStringLiteral in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args = "The %s developers";
  this = in_RDI;
  __lhs = in_RDI;
  _(in_stack_ffffffffffffff68);
  tinyformat::format<char[13]>(in_RSI,(char (*) [13])args);
  bilingual_str::~bilingual_str(in_stack_ffffffffffffff18);
  in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 & 0xffffff;
  std::operator+(__lhs,in_RSI);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_RSI,args,in_stack_ffffffffffffff38);
  if (sVar2 == 0xffffffffffffffff) {
    std::operator+(in_stack_ffffffffffffff68.lit,in_stack_ffffffffffffff60);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),(char *)this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this,in_RDI);
    std::__cxx11::string::~string(&in_stack_ffffffffffffff18->original);
    std::__cxx11::string::~string(&in_stack_ffffffffffffff18->original);
  }
  std::__cxx11::string::~string(&in_stack_ffffffffffffff18->original);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

std::string CopyrightHolders(const std::string& strPrefix)
{
    const auto copyright_devs = strprintf(_(COPYRIGHT_HOLDERS).translated, COPYRIGHT_HOLDERS_SUBSTITUTION);
    std::string strCopyrightHolders = strPrefix + copyright_devs;

    // Make sure Bitcoin Core copyright is not removed by accident
    if (copyright_devs.find("Bitcoin Core") == std::string::npos) {
        strCopyrightHolders += "\n" + strPrefix + "The Bitcoin Core developers";
    }
    return strCopyrightHolders;
}